

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_op.cc
# Opt level: O2

Nonnull<const_char_*> __thiscall
absl::lts_20250127::log_internal::CheckOpMessageBuilder::NewString(CheckOpMessageBuilder *this)

{
  undefined8 *puVar1;
  
  std::operator<<((ostream *)this,")");
  puVar1 = (undefined8 *)operator_new(0x20);
  std::__cxx11::stringbuf::str();
  DoIgnoreLeak(puVar1);
  return (Nonnull<const_char_*>)*puVar1;
}

Assistant:

absl::Nonnull<const char*> CheckOpMessageBuilder::NewString() {
  stream_ << ")";
  // There's no need to free this string since the process is crashing.
  return absl::IgnoreLeak(new std::string(std::move(stream_).str()))->c_str();
}